

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  undefined8 uStack_150;
  StringPiece vec [17];
  
  lVar4 = 8;
  do {
    *(undefined8 *)((long)&uStack_150 + lVar4) = 0;
    *(undefined4 *)((long)&vec[0].ptr_ + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x118);
  uVar3 = MaxSubmatch(rewrite);
  if (uVar3 < 0x11) {
    bVar2 = false;
    bVar1 = Match(re,text,0,text->length_,UNANCHORED,vec,uVar3 + 1);
    if (bVar1) {
      out->_M_string_length = 0;
      *(out->_M_dataplus)._M_p = '\0';
      bVar2 = Rewrite(re,out,rewrite,vec,uVar3 + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RE2::Extract(const StringPiece &text,
                 const RE2& re,
                 const StringPiece &rewrite,
                 string *out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}